

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::TextScriptModule,_std::default_delete<wabt::TextScriptModule>_>
wabt::MakeUnique<wabt::TextScriptModule>(void)

{
  TextScriptModule *this;
  __uniq_ptr_data<wabt::TextScriptModule,_std::default_delete<wabt::TextScriptModule>,_true,_true>
  in_RDI;
  
  this = (TextScriptModule *)operator_new(0x380);
  memset(this,0,0x380);
  TextScriptModule::TextScriptModule(this);
  *(TextScriptModule **)
   in_RDI.
   super___uniq_ptr_impl<wabt::TextScriptModule,_std::default_delete<wabt::TextScriptModule>_>._M_t.
   super__Tuple_impl<0UL,_wabt::TextScriptModule_*,_std::default_delete<wabt::TextScriptModule>_>.
   super__Head_base<0UL,_wabt::TextScriptModule_*,_false>._M_head_impl = this;
  return (__uniq_ptr_data<wabt::TextScriptModule,_std::default_delete<wabt::TextScriptModule>,_true,_true>
          )(tuple<wabt::TextScriptModule_*,_std::default_delete<wabt::TextScriptModule>_>)
           in_RDI.
           super___uniq_ptr_impl<wabt::TextScriptModule,_std::default_delete<wabt::TextScriptModule>_>
           ._M_t.
           super__Tuple_impl<0UL,_wabt::TextScriptModule_*,_std::default_delete<wabt::TextScriptModule>_>
           .super__Head_base<0UL,_wabt::TextScriptModule_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}